

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v10::detail::print(FILE *f,string_view text)

{
  string_view text_00;
  size_t sVar1;
  size_t __n;
  size_t extraout_RDX;
  char *pcVar2;
  FILE *f_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R8;
  basic_string_view<char> fmt;
  type args;
  buffer<char> bStack_250;
  char acStack_230 [504];
  size_t sStack_38;
  
  __n = text.size_;
  f_00 = (FILE *)&stack0xffffffffffffffd8;
  pcVar2 = (char *)0x1;
  sVar1 = fwrite(text.data_,1,__n,(FILE *)f);
  if (__n <= sVar1) {
    return;
  }
  print((detail *)&stack0xffffffffffffffd8);
  bStack_250.size_ = 0;
  bStack_250._vptr_buffer = (_func_int **)&PTR_grow_002263d8;
  bStack_250.capacity_ = 500;
  fmt.size_ = extraout_RDX;
  fmt.data_ = pcVar2;
  args.field_1.args_ = in_R8.args_;
  args.desc_ = (unsigned_long_long)f;
  bStack_250.ptr_ = acStack_230;
  sStack_38 = __n;
  vformat_to<char>(&bStack_250,fmt,args,(locale_ref)0x0);
  text_00.size_ = bStack_250.size_;
  text_00.data_ = bStack_250.ptr_;
  print(f_00,text_00);
  if (bStack_250.ptr_ != acStack_230) {
    operator_delete(bStack_250.ptr_,bStack_250.capacity_);
  }
  return;
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#ifdef _WIN32
  int fd = _fileno(f);
  if (_isatty(fd)) {
    std::fflush(f);
    if (write_console(fd, text)) return;
  }
#endif
  fwrite_fully(text.data(), text.size(), f);
}